

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O3

void __thiscall
delta_complex_t::delta_complex_t(delta_complex_t *this,vector<int,_std::allocator<int>_> *vertices)

{
  vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_> *this_00;
  vector<clique_t,_std::allocator<clique_t>_> *this_01;
  pointer piVar1;
  ulong _vertex;
  undefined1 local_118 [64];
  pointer local_d8;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_d0 [2];
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_98;
  _Hashtable<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  (this->cliques).
  super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cliques).
  super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cells).
  super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cliques).
  super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cells).
  super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cells).
  super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  add_dimension(this);
  piVar1 = (vertices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  if ((vertices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    _vertex = 0;
    do {
      this_00 = (this->cells).
                super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      delta_complex_cell_t::delta_complex_cell_t
                ((delta_complex_cell_t *)local_118,_vertex,(float)piVar1[_vertex]);
      std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::
      emplace_back<delta_complex_cell_t>(this_00,(delta_complex_cell_t *)local_118);
      std::
      _Hashtable<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_68);
      std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
      ~_Rb_tree(&local_98);
      std::
      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ::~vector(local_d0);
      if ((pointer)local_118._48_8_ != (pointer)0x0) {
        operator_delete((void *)local_118._48_8_,(long)local_d8 - local_118._48_8_);
      }
      if ((pointer)local_118._24_8_ != (pointer)0x0) {
        operator_delete((void *)local_118._24_8_,local_118._40_8_ - local_118._24_8_);
      }
      if ((pointer)local_118._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_118._0_8_,local_118._16_8_ - local_118._0_8_);
      }
      this_01 = (this->cliques).
                super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      clique_t::clique_t((clique_t *)local_118,_vertex);
      std::vector<clique_t,_std::allocator<clique_t>_>::emplace_back<clique_t>
                (this_01,(clique_t *)local_118);
      std::
      _Hashtable<long,_std::pair<const_long,_long>,_std::allocator<std::pair<const_long,_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<long,_std::pair<const_long,_long>,_std::allocator<std::pair<const_long,_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)(local_118 + 0x38));
      if ((pointer)local_118._24_8_ != (pointer)0x0) {
        operator_delete((void *)local_118._24_8_,local_118._40_8_ - local_118._24_8_);
      }
      if ((pointer)local_118._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_118._0_8_,local_118._16_8_ - local_118._0_8_);
      }
      _vertex = _vertex + 1;
      piVar1 = (vertices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (_vertex < (ulong)((long)(vertices->super__Vector_base<int,_std::allocator<int>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)piVar1 >> 2))
    ;
  }
  return;
}

Assistant:

delta_complex_t(std::vector<int> vertices){
		add_dimension();
		for( int i = 0; i < vertices.size(); i++ ){
            cells[0].push_back(delta_complex_cell_t(i,vertices[i]));
			cliques[0].push_back(clique_t(i));
        }
	}